

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECDecoding.cpp
# Opt level: O0

void __thiscall
ECdecoding::fanoCheck(ECdecoding *this,SeqEntry *sequence,char2double *nextProbs,char base)

{
  char cVar1;
  size_type sVar2;
  type pdVar3;
  char in_CL;
  long in_RSI;
  string *in_RDI;
  SeqEntry newSeq_1;
  SeqEntry newSeq;
  SeqEntry *in_stack_fffffffffffffb00;
  SeqEntry *this_00;
  SeqEntry *in_stack_fffffffffffffb28;
  SeqEntry *in_stack_fffffffffffffb30;
  key_type *in_stack_fffffffffffffb58;
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
  *in_stack_fffffffffffffb60;
  SeqEntry local_280;
  char local_19;
  
  local_19 = in_CL;
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (in_RSI + 8));
  if (sVar2 <= *(uint *)&(in_RDI->_M_dataplus)._M_p) {
    pdVar3 = robin_hood::detail::
             Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
             operator[]<double>(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    if ((*pdVar3 != 0.0) || (NAN(*pdVar3))) {
      cVar1 = defaultReturn(in_RDI,(uint32_t)((ulong)in_stack_fffffffffffffb00 >> 0x20));
      if (cVar1 == local_19) {
        this_00 = &local_280;
        SeqEntry::SeqEntry(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
        updateState((ECdecoding *)newSeq_1.ac.super_acBase.qr,
                    (SeqEntry *)newSeq_1.ac.super_acBase.hr,newSeq_1.ac.super_acBase.high._7_1_,
                    (char2double *)newSeq_1.ac.super_acBase.low,newSeq_1.ac.super_acBase.mask._7_1_,
                    (int)newSeq_1.ac.super_acBase.mask);
        SeqEntry::~SeqEntry(this_00);
      }
      else {
        SeqEntry::SeqEntry(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
        updateState((ECdecoding *)newSeq_1.ac.super_acBase.qr,
                    (SeqEntry *)newSeq_1.ac.super_acBase.hr,newSeq_1.ac.super_acBase.high._7_1_,
                    (char2double *)newSeq_1.ac.super_acBase.low,newSeq_1.ac.super_acBase.mask._7_1_,
                    (int)newSeq_1.ac.super_acBase.mask);
        SeqEntry::~SeqEntry(in_stack_fffffffffffffb00);
      }
    }
  }
  return;
}

Assistant:

void ECdecoding::fanoCheck(SeqEntry &sequence, char2double &nextProbs, char base) {
    //switched sequence.pos to sequence.seq.size(), as it would lead to wrong results if indels are present
    if (sequence.seq.size() > messageLen)
        return;
    if (static_cast<bool>(nextProbs[base])) {
        //Input sequence at pos x == candidate sequence at pos x
        if (defaultReturn(readSeq, sequence.pos) == base) {
            SeqEntry newSeq = sequence;
            updateState(newSeq, true, nextProbs, base, 1);
        } else {
            SeqEntry newSeq = sequence;
            updateState(newSeq, false, nextProbs, base, 1);
        }
    }
}